

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodeSetPtr xmlXPathGetElementsByIds(xmlDocPtr doc,xmlChar *ids)

{
  int iVar1;
  xmlChar *ID_00;
  bool bVar2;
  xmlNodePtr local_48;
  xmlNodePtr elem;
  xmlAttrPtr attr;
  xmlChar *ID;
  xmlChar *cur;
  xmlNodeSetPtr ret;
  xmlChar *ids_local;
  xmlDocPtr doc_local;
  
  if (ids == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    doc_local = (xmlDocPtr)xmlXPathNodeSetCreate((xmlNodePtr)0x0);
    ID = ids;
    if (doc_local != (xmlDocPtr)0x0) {
      while( true ) {
        bVar2 = true;
        if ((*ID != ' ') && ((*ID < 9 || (bVar2 = true, 10 < *ID)))) {
          bVar2 = *ID == '\r';
        }
        ret = (xmlNodeSetPtr)ids;
        if (!bVar2) break;
        ID = ID + 1;
      }
      while (*ID != '\0') {
        while( true ) {
          bVar2 = false;
          if ((*ID != ' ') &&
             (((*ID < 9 || (bVar2 = false, 10 < *ID)) && (bVar2 = false, *ID != '\r')))) {
            bVar2 = *ID != '\0';
          }
          if (!bVar2) break;
          ID = ID + 1;
        }
        ID_00 = xmlStrndup((xmlChar *)ret,(int)ID - (int)ret);
        if (ID_00 == (xmlChar *)0x0) {
          xmlXPathFreeNodeSet((xmlNodeSetPtr)doc_local);
          return (xmlNodeSetPtr)0x0;
        }
        local_48 = (xmlNodePtr)xmlGetID(doc,ID_00);
        (*xmlFree)(ID_00);
        if (local_48 != (xmlNodePtr)0x0) {
          if (local_48->type == XML_ATTRIBUTE_NODE) {
            local_48 = local_48->parent;
          }
          else if (local_48->type != XML_ELEMENT_NODE) {
            local_48 = (xmlNodePtr)0x0;
          }
          if ((local_48 != (xmlNodePtr)0x0) &&
             (iVar1 = xmlXPathNodeSetAdd((xmlNodeSetPtr)doc_local,local_48), iVar1 < 0)) {
            xmlXPathFreeNodeSet((xmlNodeSetPtr)doc_local);
            return (xmlNodeSetPtr)0x0;
          }
        }
        while( true ) {
          bVar2 = true;
          if ((*ID != ' ') && ((*ID < 9 || (bVar2 = true, 10 < *ID)))) {
            bVar2 = *ID == '\r';
          }
          if (!bVar2) break;
          ID = ID + 1;
        }
        ret = (xmlNodeSetPtr)ID;
      }
    }
  }
  return (xmlNodeSetPtr)doc_local;
}

Assistant:

static xmlNodeSetPtr
xmlXPathGetElementsByIds (xmlDocPtr doc, const xmlChar *ids) {
    xmlNodeSetPtr ret;
    const xmlChar *cur = ids;
    xmlChar *ID;
    xmlAttrPtr attr;
    xmlNodePtr elem = NULL;

    if (ids == NULL) return(NULL);

    ret = xmlXPathNodeSetCreate(NULL);
    if (ret == NULL)
        return(ret);

    while (IS_BLANK_CH(*cur)) cur++;
    while (*cur != 0) {
	while ((!IS_BLANK_CH(*cur)) && (*cur != 0))
	    cur++;

        ID = xmlStrndup(ids, cur - ids);
	if (ID == NULL) {
            xmlXPathFreeNodeSet(ret);
            return(NULL);
        }
        /*
         * We used to check the fact that the value passed
         * was an NCName, but this generated much troubles for
         * me and Aleksey Sanin, people blatantly violated that
         * constraint, like Visa3D spec.
         * if (xmlValidateNCName(ID, 1) == 0)
         */
        attr = xmlGetID(doc, ID);
        xmlFree(ID);
        if (attr != NULL) {
            if (attr->type == XML_ATTRIBUTE_NODE)
                elem = attr->parent;
            else if (attr->type == XML_ELEMENT_NODE)
                elem = (xmlNodePtr) attr;
            else
                elem = NULL;
            if (elem != NULL) {
                if (xmlXPathNodeSetAdd(ret, elem) < 0) {
                    xmlXPathFreeNodeSet(ret);
                    return(NULL);
                }
            }
        }

	while (IS_BLANK_CH(*cur)) cur++;
	ids = cur;
    }
    return(ret);
}